

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_cl(DisasContext_conflict6 *ctx,uint32_t opc,int rd,int rs)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGv_i64 ret;
  TCGv_i64 a2;
  uintptr_t o;
  TCGOpcode opc_00;
  
  if (rd == 0) {
    return;
  }
  tcg_ctx = ctx->uc->tcg_ctx;
  ret = tcg_ctx->cpu_gpr[(uint)rd];
  if (rs == 0) {
    opc_00 = INDEX_op_movi_i64;
    a2 = (TCGv_i64)0x0;
LAB_009a7386:
    tcg_gen_op2_mips64el(tcg_ctx,opc_00,(TCGArg)(ret + (long)&tcg_ctx->pool_cur),(TCGArg)a2);
  }
  else if (tcg_ctx->cpu_gpr[rs] != ret) {
    a2 = tcg_ctx->cpu_gpr[rs] + (long)tcg_ctx;
    opc_00 = INDEX_op_mov_i64;
    goto LAB_009a7386;
  }
  switch(opc - 0x10) {
  case 0:
    goto switchD_009a73b3_caseD_70000020;
  case 1:
  case 3:
    break;
  case 2:
    goto switchD_009a73b3_caseD_70000024;
  default:
    switch(opc) {
    case 0x70000020:
      goto switchD_009a73b3_caseD_70000020;
    case 0x70000021:
    case 0x70000025:
      break;
    default:
      goto switchD_009a73b3_caseD_70000022;
    case 0x70000024:
      goto switchD_009a73b3_caseD_70000024;
    }
  }
  tcg_gen_not_i64_mips64el(tcg_ctx,ret,ret);
  if ((int)opc < 0x70000020) {
    if (1 < opc - 0x10) {
      if (1 < opc - 0x12) {
switchD_009a73b3_caseD_70000022:
        return;
      }
switchD_009a73b3_caseD_70000024:
      tcg_gen_clzi_i64_mips64el(tcg_ctx,ret,ret,0x40);
      return;
    }
  }
  else {
    if (opc + 0x8fffffdc < 2) goto switchD_009a73b3_caseD_70000024;
    if (1 < opc + 0x8fffffe0) {
      return;
    }
  }
switchD_009a73b3_caseD_70000020:
  tcg_gen_ext32u_i64_mips64el(tcg_ctx,ret,ret);
  tcg_gen_clzi_i64_mips64el(tcg_ctx,ret,ret,0x40);
  tcg_gen_subi_i64_mips64el(tcg_ctx,ret,ret,0x20);
  return;
}

Assistant:

static void gen_cl(DisasContext *ctx, uint32_t opc,
                   int rd, int rs)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0;

    if (rd == 0) {
        /* Treat as NOP. */
        return;
    }
    t0 = tcg_ctx->cpu_gpr[rd];
    gen_load_gpr(tcg_ctx, t0, rs);

    switch (opc) {
    case OPC_CLO:
    case R6_OPC_CLO:
#if defined(TARGET_MIPS64)
    case OPC_DCLO:
    case R6_OPC_DCLO:
#endif
        tcg_gen_not_tl(tcg_ctx, t0, t0);
        break;
    }

    switch (opc) {
    case OPC_CLO:
    case R6_OPC_CLO:
    case OPC_CLZ:
    case R6_OPC_CLZ:
        tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
        tcg_gen_clzi_tl(tcg_ctx, t0, t0, TARGET_LONG_BITS);
        tcg_gen_subi_tl(tcg_ctx, t0, t0, TARGET_LONG_BITS - 32);
        break;
#if defined(TARGET_MIPS64)
    case OPC_DCLO:
    case R6_OPC_DCLO:
    case OPC_DCLZ:
    case R6_OPC_DCLZ:
        tcg_gen_clzi_i64(tcg_ctx, t0, t0, 64);
        break;
#endif
    }
}